

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void process_file(path *file,vector<IncludePath,_std::allocator<IncludePath>_> *include_paths,
                 map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
                 *headers,ProcessResult *result)

{
  pointer pCVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  istream *piVar5;
  size_t *psVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  long lVar8;
  char *pcVar9;
  string *psVar10;
  int alt_idx;
  ulong uVar11;
  string fixed_path_with_quotes;
  string line;
  string path_with_quotes;
  IncludeStmt current;
  vector<Candidate,_std::allocator<Candidate>_> candidate_fixes;
  string path;
  string behind_path;
  string prefix_user;
  string prefix_system;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  string prefix_all;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  Candidate fix;
  stringstream buffer;
  ostream local_3b0 [376];
  ifstream in;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"    Process ");
  std::filesystem::__cxx11::path::string((string *)&in,file);
  poVar4 = std::operator<<(poVar4,(string *)&in);
  poVar4 = std::operator<<(poVar4," ...");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&in);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  std::filesystem::__cxx11::path::string((string *)&fix,file);
  std::ifstream::ifstream(&in,(string *)&fix,_S_in);
  std::__cxx11::string::~string((string *)&fix);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&line,'\n');
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      if (dry_run == false) {
        std::filesystem::__cxx11::path::string(&current.path,file);
        std::ofstream::ofstream(&fix,(string *)&current,_S_out);
        std::__cxx11::string::~string((string *)&current);
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)&fix,(string *)&current);
        std::__cxx11::string::~string((string *)&current);
        std::ofstream::close();
        std::ofstream::~ofstream(&fix);
      }
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&in);
      std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix_all,"#include ",(allocator<char> *)&fix);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix_system,"#include <",(allocator<char> *)&fix);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix_user,"#include \"",(allocator<char> *)&fix);
    bVar2 = boost::algorithm::
            starts_with<std::__cxx11::string,std::__cxx11::string,boost::algorithm::is_equal>
                      (&line,&prefix_user);
    if ((bVar2) ||
       ((bVar2 = boost::algorithm::
                 starts_with<std::__cxx11::string,std::__cxx11::string,boost::algorithm::is_equal>
                           (&line,&prefix_system), bVar2 && (process_system_includes == true)))) {
      result->total = result->total + 1;
      path._M_dataplus._M_p = (pointer)&path.field_2;
      path._M_string_length = 0;
      behind_path._M_dataplus._M_p = (pointer)&behind_path.field_2;
      behind_path._M_string_length = 0;
      path.field_2._M_local_buf[0] = '\0';
      behind_path.field_2._M_local_buf[0] = '\0';
      path_with_quotes._M_dataplus._M_p = (pointer)&path_with_quotes.field_2;
      path_with_quotes._M_string_length = 0;
      path_with_quotes.field_2._M_local_buf[0] = '\0';
      bVar2 = boost::algorithm::
              starts_with<std::__cxx11::string,std::__cxx11::string,boost::algorithm::is_equal>
                        (&line,&prefix_user);
      pcVar9 = "\"";
      if (bVar2) {
LAB_001083ca:
        bVar2 = !bVar2;
        std::__cxx11::string::find((char *)&line,(ulong)pcVar9);
      }
      else {
        bVar3 = boost::algorithm::
                starts_with<std::__cxx11::string,std::__cxx11::string,boost::algorithm::is_equal>
                          (&line,&prefix_system);
        pcVar9 = ">";
        if (bVar3) goto LAB_001083ca;
        bVar2 = false;
      }
      std::__cxx11::string::substr((ulong)&fix,(ulong)&line);
      std::__cxx11::string::operator=((string *)&path,(string *)&fix);
      std::__cxx11::string::~string((string *)&fix);
      std::__cxx11::string::substr((ulong)&fix,(ulong)&line);
      std::__cxx11::string::operator=((string *)&path_with_quotes,(string *)&fix);
      std::__cxx11::string::~string((string *)&fix);
      std::__cxx11::string::substr((ulong)&fix,(ulong)&line);
      std::__cxx11::string::operator=((string *)&behind_path,(string *)&fix);
      std::__cxx11::string::~string((string *)&fix);
      std::__cxx11::string::string((string *)&current,(string *)&path);
      current.system = bVar2;
      fix_include(&candidate_fixes,&current,file,include_paths,headers,prefer_relative_to_root);
      if (candidate_fixes.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
          super__Vector_impl_data._M_start ==
          candidate_fixes.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        poVar4 = std::operator<<(local_3b0,(string *)&line);
        std::endl<char,std::char_traits<char>>(poVar4);
        result->failed = result->failed + 1;
        if ((omit_system_failed & bVar2) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&RED_abi_cxx11_);
          poVar4 = std::operator<<(poVar4,anon_var_dwarf_136c9);
          poVar4 = std::operator<<(poVar4,(string *)&path_with_quotes);
          poVar4 = std::operator<<(poVar4,(string *)&CLEAR_abi_cxx11_);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
      else {
        Candidate::Candidate
                  (&fix,candidate_fixes.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        fixed_path_with_quotes._M_dataplus._M_p = (pointer)&fixed_path_with_quotes.field_2;
        fixed_path_with_quotes._M_string_length = 0;
        fixed_path_with_quotes.field_2._M_local_buf[0] = '\0';
        if (bVar2 == false) {
          if ((fix.search_path.system == false) || (user_to_system == false)) goto LAB_00108659;
LAB_001085ee:
          std::operator+(&local_620,"<",&fix.header);
          std::operator+(&local_5e0,&local_620,">");
          std::__cxx11::string::operator=((string *)&fixed_path_with_quotes,(string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_620);
          psVar6 = &result->user_to_system;
          if (bVar2 != false) goto LAB_001086bb;
LAB_00108651:
          *psVar6 = *psVar6 + 1;
          bVar2 = true;
        }
        else {
          if ((fix.search_path.system != false) || (user_to_system == false)) goto LAB_001085ee;
LAB_00108659:
          std::operator+(&local_620,"\"",&fix.header);
          std::operator+(&local_5e0,&local_620,"\"");
          std::__cxx11::string::operator=((string *)&fixed_path_with_quotes,(string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_620);
          psVar6 = &result->system_to_user;
          if (bVar2 != false) goto LAB_00108651;
LAB_001086bb:
          bVar2 = false;
        }
        poVar4 = std::operator<<(local_3b0,"#include ");
        poVar4 = std::operator<<(poVar4,(string *)&fixed_path_with_quotes);
        poVar4 = std::operator<<(poVar4,(string *)&behind_path);
        std::endl<char,std::char_traits<char>>(poVar4);
        bVar3 = std::operator!=(&fix.header,&path);
        if (bVar3) {
          result->replaced_path = result->replaced_path + 1;
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&YELLOW_abi_cxx11_);
          poVar4 = std::operator<<(poVar4,anon_var_dwarf_1364b);
          std::operator<<(poVar4,(string *)&path_with_quotes);
          poVar4 = std::operator<<((ostream *)&std::cout,"  ->  ");
          std::operator<<(poVar4,(string *)&fixed_path_with_quotes);
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&DIM_abi_cxx11_);
          poVar4 = std::operator<<(poVar4,"  (distance: fn=");
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,fix.filename_distance);
          poVar4 = std::operator<<(poVar4,"; dir=");
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,fix.folder_distance);
          poVar4 = std::operator<<(poVar4,") from ");
          poVar4 = std::filesystem::__cxx11::operator<<(poVar4,(path *)&fix);
LAB_001088d2:
          poVar4 = std::operator<<(poVar4,(string *)&CLEAR_abi_cxx11_);
          std::endl<char,std::char_traits<char>>(poVar4);
          lVar8 = 0x58;
          for (uVar11 = 1;
              pCVar1 = candidate_fixes.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                       _M_impl.super__Vector_impl_data._M_start,
              uVar11 < (ulong)(((long)candidate_fixes.
                                      super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)candidate_fixes.
                                     super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                                     _M_impl.super__Vector_impl_data._M_start) / 0x58);
              uVar11 = uVar11 + 1) {
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)&DIM_abi_cxx11_);
            poVar4 = std::operator<<(poVar4,"           - Alternative: ");
            std::operator<<(poVar4,(string *)((long)&(pCVar1->header)._M_dataplus._M_p + lVar8));
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)&DIM_abi_cxx11_);
            poVar4 = std::operator<<(poVar4,"  (distance: fn=");
            poVar4 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar4,*(int *)((long)&pCVar1->filename_distance + lVar8)
                               );
            poVar4 = std::operator<<(poVar4,"; dir=");
            poVar4 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar4,*(int *)((long)&pCVar1->folder_distance + lVar8));
            poVar4 = std::operator<<(poVar4,") from ");
            pbVar7 = std::filesystem::__cxx11::operator<<
                               (poVar4,(path *)((long)&(pCVar1->search_path).path._M_pathname.
                                                       _M_dataplus._M_p + lVar8));
            poVar4 = std::operator<<(pbVar7,(string *)&CLEAR_abi_cxx11_);
            std::endl<char,std::char_traits<char>>(poVar4);
            lVar8 = lVar8 + 0x58;
          }
        }
        else {
          if (bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)&BLUE_abi_cxx11_);
            poVar4 = std::operator<<(poVar4,anon_var_dwarf_1367b);
            std::operator<<(poVar4,(string *)&path_with_quotes);
            poVar4 = std::operator<<((ostream *)&std::cout,"  ->  ");
            psVar10 = &fixed_path_with_quotes;
LAB_001088ca:
            poVar4 = std::operator<<(poVar4,(string *)psVar10);
            goto LAB_001088d2;
          }
          result->untouched = result->untouched + 1;
          if (omit_untouched == false) {
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)&GREEN_abi_cxx11_);
            poVar4 = std::operator<<(poVar4,anon_var_dwarf_13695);
            psVar10 = &path_with_quotes;
            goto LAB_001088ca;
          }
        }
        std::__cxx11::string::~string((string *)&fixed_path_with_quotes);
        Candidate::~Candidate(&fix);
      }
      std::vector<Candidate,_std::allocator<Candidate>_>::~vector(&candidate_fixes);
      std::__cxx11::string::~string((string *)&current);
      std::__cxx11::string::~string((string *)&path_with_quotes);
      std::__cxx11::string::~string((string *)&behind_path);
      std::__cxx11::string::~string((string *)&path);
    }
    else {
      poVar4 = std::operator<<(local_3b0,(string *)&line);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&prefix_user);
    std::__cxx11::string::~string((string *)&prefix_system);
    std::__cxx11::string::~string((string *)&prefix_all);
  } while( true );
}

Assistant:

void process_file(fs::path file, const std::vector<IncludePath> &include_paths,
                  const std::map<IncludePath, std::vector<fs::path>> &headers,
                  ProcessResult *result) {
  std::cout << "    Process " << file.string() << " ..." << std::endl;
  std::stringstream buffer;
  std::ifstream in(file.string());
  std::string line;
  while (std::getline(in, line, '\n')) {
    std::string prefix_all = "#include ";
    std::string prefix_system = "#include <";
    std::string prefix_user = "#include \"";
    if (boost::starts_with(line, prefix_user) ||
        (boost::starts_with(line, prefix_system) && process_system_includes)) {
      (result->total)++;

      std::string path, behind_path, path_with_quotes;
      size_t endPathPos = 0;
      bool system = false;
      if (boost::starts_with(line, prefix_user)) {
        endPathPos = line.find("\"", prefix_user.size());
        system = false;
      } else if (boost::starts_with(line, prefix_system)) {
        endPathPos = line.find(">", prefix_system.size());
        system = true;
      }

      path = line.substr(prefix_user.size(), endPathPos - prefix_user.size());
      path_with_quotes =
          line.substr(prefix_all.size(), endPathPos - prefix_all.size() + 1);
      behind_path = line.substr(endPathPos + 1);

      IncludeStmt current{path, system};
      std::vector<Candidate> candidate_fixes = fix_include(
          current, file, include_paths, headers, prefer_relative_to_root);

      if (!candidate_fixes.empty()) {
        Candidate fix = candidate_fixes[0];
        std::string fixed_path_with_quotes;
        bool emit_system_include = false;
        if ((system && fix.search_path.system) || // already good
            (!system && fix.search_path.system &&
             user_to_system) || // changed to system
            (system && !fix.search_path.system &&
             !user_to_system)) { // can't touch
          emit_system_include = true;
        }

        if (emit_system_include) {
          fixed_path_with_quotes = "<" + fix.header + ">";
        } else {
          fixed_path_with_quotes = "\"" + fix.header + "\"";
        }

        bool changed_include_type = system != emit_system_include;
        if (changed_include_type) {
          if (system) {
            result->system_to_user++;
          } else {
            result->user_to_system++;
          }
        }

        buffer << "#include " << fixed_path_with_quotes << behind_path
               << std::endl;
        if (fix.header != path) {
          (result->replaced_path)++;

          std::cout << YELLOW
                    << "        👕 Replace include path: " << path_with_quotes;
          std::cout << "  ->  " << fixed_path_with_quotes;
          std::cout << DIM << "  (distance: fn=" << fix.filename_distance
                    << "; dir=" << fix.folder_distance << ") from "
                    << fix.search_path.path << CLEAR << std::endl;
        } else if (changed_include_type) {
          std::cout << BLUE
                    << "        💄 Change include type: " << path_with_quotes;
          std::cout << "  ->  " << fixed_path_with_quotes << CLEAR << std::endl;
        } else {
          (result->untouched)++;

          if (omit_untouched) {
            continue; // the line is written.
          }
          std::cout << GREEN
                    << "        ✅ Untouched include: " << path_with_quotes
                    << CLEAR << std::endl;
        }

        for (int alt_idx = 1; alt_idx < candidate_fixes.size(); ++alt_idx) {
          Candidate &alt = candidate_fixes[alt_idx];
          std::cout << DIM << "           - Alternative: " << alt.header;
          std::cout << DIM << "  (distance: fn=" << alt.filename_distance
                    << "; dir=" << alt.folder_distance << ") from "
                    << alt.search_path.path << CLEAR << std::endl;
        }

      } else {
        buffer << line << std::endl;
        (result->failed)++;

        if (omit_system_failed && system) {
          continue; // the line is written.
        }
        std::cout << RED
                  << "        ❓ Failed to fix include: " << path_with_quotes
                  << CLEAR << std::endl;
      }
    } else {
      buffer << line << std::endl;
    }
  }
  in.close();

  if (!dry_run) {
    std::ofstream out(file.string());
    out << buffer.str();
    out.close();
  }
}